

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

int32_t icu_63::Transliterator::countAvailableVariants(UnicodeString *source,UnicodeString *target)

{
  UBool UVar1;
  int32_t local_40;
  UErrorCode local_24;
  UErrorCode ec;
  Mutex lock;
  UnicodeString *target_local;
  UnicodeString *source_local;
  
  lock.fMutex = (UMutex *)target;
  Mutex::Mutex((Mutex *)&stack0xffffffffffffffe0,&registryMutex);
  local_24 = U_ZERO_ERROR;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry(&local_24);
    if (UVar1 == '\0') {
      local_40 = 0;
      goto LAB_002e5337;
    }
  }
  local_40 = _countAvailableVariants(source,(UnicodeString *)lock.fMutex);
LAB_002e5337:
  Mutex::~Mutex((Mutex *)&stack0xffffffffffffffe0);
  return local_40;
}

Assistant:

int32_t U_EXPORT2 Transliterator::countAvailableVariants(const UnicodeString& source,
                                               const UnicodeString& target) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    return HAVE_REGISTRY(ec) ? _countAvailableVariants(source, target) : 0;
}